

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall foxxll::config::load_default_config(config *this)

{
  disk_config entry1;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [40];
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined2 local_140;
  
  tlx::Logger::Logger((Logger *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"foxxll: [Warning] no config file found.",0x27);
  tlx::Logger::~Logger((Logger *)local_188);
  tlx::Logger::Logger((Logger *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"foxxll: Using default disk configuration.",0x29);
  tlx::Logger::~Logger((Logger *)local_188);
  (*this->_vptr_config[6])(&local_1a8,this);
  (*this->_vptr_config[7])(&local_1c8,this);
  disk_config::disk_config((disk_config *)local_188,&local_1a8,0x3e800000,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_140 = 0x101;
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::push_back
            (&this->disks_list,(value_type *)local_188);
  this->first_flash = this->first_flash + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_p != &local_150) {
    operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  return;
}

Assistant:

void config::load_default_config()
{
    TLX_LOG1 << "foxxll: [Warning] no config file found.";
    TLX_LOG1 << "foxxll: Using default disk configuration.";
    disk_config entry1(default_disk_path(), 1000 * 1024 * 1024,
                       default_disk_io_impl());
    entry1.delete_on_exit = true;
    entry1.autogrow = true;
    add_disk(entry1);
}